

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall AI::canrev(AI *this,int i,int j,int who)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  reference pvVar3;
  reference ppVar4;
  int num;
  pair<int,_int> *dir;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  int who_local;
  int j_local;
  int i_local;
  AI *this_local;
  
  if ((((-1 < i) && ((ulong)(long)i < this->boardSize)) && (-1 < j)) &&
     ((ulong)(long)j < this->boardSize)) {
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](this->board,(long)i);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)j);
    if (*pvVar3 == 0) {
      __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         (&this->directions);
      dir = (pair<int,_int> *)
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                      (&this->directions);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                         *)&dir), bVar1) {
        ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&__end1);
        iVar2 = reverseDirection(this,i,j,who,*ppVar4,false);
        if (iVar2 != 0) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&__end1);
      }
    }
  }
  return false;
}

Assistant:

bool AI::canrev(int i, int j, int who) {
    if (i < 0 || i >= boardSize || j < 0 || j >= boardSize) return false;
    if (board[i][j] != EMPTY) return false;
    for (auto &dir: directions) {
        int num = reverseDirection(i, j, who, dir);
        if (num) return true;
    }
    return false;
}